

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

uint32_t helper_bcdcfn_ppc64(ppc_avr_t *r,ppc_avr_t *b,uint32_t ps)

{
  uint16_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uStack_18;
  ppc_avr_t ret;
  
  uVar1 = b->u16[0];
  uStack_18 = 0;
  ret.u64[0] = 0;
  uVar4 = 1;
  do {
    bVar2 = true;
    if ((ushort)(b->u16[uVar4] - 0x3a) < 0xfff6) break;
    bVar5 = (byte)b->u16[uVar4];
    if ((uVar4 & 1) == 0) {
      uVar6 = uVar4 >> 1 & 0x7fffffff;
      *(byte *)((long)&uStack_18 + uVar6) = *(byte *)((long)&uStack_18 + uVar6) & 0xf0 | bVar5 & 0xf
      ;
    }
    else {
      uVar6 = uVar4 >> 1 & 0x7fffffff;
      *(byte *)((long)&uStack_18 + uVar6) = bVar5 << 4 | *(byte *)((long)&uStack_18 + uVar6) & 0xf;
    }
    uVar4 = uVar4 + 1;
    bVar2 = (uVar1 - 0x2b & 0xfffd) != 0;
  } while (uVar4 != 8);
  bVar5 = 0xd;
  if (uVar1 == 0x2b) {
    bVar5 = (ps != 0) * '\x03' | 0xc;
  }
  uStack_18 = CONCAT71(uStack_18._1_7_,(byte)uStack_18 & 0xf0 | bVar5);
  if ((ret.u64[0] == 0) && (uStack_18 < 0x10)) {
    uVar3 = 2;
  }
  else if ((byte)(bVar5 - 10) < 6) {
    uVar3 = *(uint32_t *)(&DAT_00dbe430 + (ulong)(byte)(bVar5 - 10) * 4);
  }
  else {
    uVar3 = 8;
  }
  if (bVar2) {
    uVar3 = 1;
  }
  r->u64[0] = uStack_18;
  r->u64[1] = ret.u64[0];
  return uVar3;
}

Assistant:

static uint16_t get_national_digit(ppc_avr_t *reg, int n)
{
    return reg->VsrH(7 - n);
}